

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

void duckdb::CreateSortKeyInternal
               (vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
                *sort_key_data,vector<duckdb::OrderModifiers,_true> *modifiers,Vector *result,
               idx_t row_count)

{
  PhysicalType type;
  LogicalTypeId LVar1;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
  *puVar2;
  SortKeyChunk chunk;
  undefined1 auVar3 [32];
  bool bVar4;
  type pSVar5;
  idx_t iVar6;
  data_ptr_t *ppdVar7;
  const_reference pvVar8;
  reference this;
  ulong uVar9;
  InternalException *pIVar10;
  data_ptr_t extraout_RDX;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
  *vector_data;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  *__range1;
  data_ptr_t pdVar11;
  size_type __n;
  data_ptr_t pdVar12;
  anon_struct_16_3_d7536bce_for_pointer aVar13;
  SortKeyLengthInfo key_lengths;
  SortKeyConstructInfo info;
  unsafe_vector<idx_t> offsets;
  string local_b0;
  vector<duckdb::OrderModifiers,_true> *local_90;
  SortKeyLengthInfo local_88;
  SortKeyConstructInfo local_68;
  void *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_90 = modifiers;
  SortKeyLengthInfo::SortKeyLengthInfo(&local_88,row_count);
  puVar2 = (sort_key_data->
           super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (sort_key_data->
                 super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar2; this_00 = this_00 + 1
      ) {
    pSVar5 = unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
             ::operator*(this_00);
    local_b0._M_string_length = pSVar5->size;
    local_b0._M_dataplus._M_p = (pointer)0x0;
    local_b0.field_2._M_local_buf[8] = '\0';
    type = (pSVar5->vec->type).physical_type_;
    bVar4 = TypeIsConstantSize(type);
    if (bVar4) {
      local_88.constant_length = local_88.constant_length + 1;
      iVar6 = GetTypeIdSize(type);
      local_88.constant_length = local_88.constant_length + iVar6;
    }
    else {
      chunk._25_7_ = local_b0.field_2._9_7_;
      chunk.has_result_index = (bool)local_b0.field_2._M_local_buf[8];
      chunk.end = local_b0._M_string_length;
      chunk.start = (idx_t)local_b0._M_dataplus._M_p;
      chunk.result_index = local_b0.field_2._M_allocated_capacity;
      GetSortKeyLengthRecursive(pSVar5,chunk,&local_88);
    }
  }
  ppdVar7 = (data_ptr_t *)operator_new__(-(ulong)(row_count >> 0x3d != 0) | row_count * 8);
  LVar1 = (result->type).id_;
  if (LVar1 == BIGINT) {
    if (row_count != 0) {
      pdVar12 = result->data;
      iVar6 = 0;
      do {
        pdVar12[0] = '\0';
        pdVar12[1] = '\0';
        pdVar12[2] = '\0';
        pdVar12[3] = '\0';
        pdVar12[4] = '\0';
        pdVar12[5] = '\0';
        pdVar12[6] = '\0';
        pdVar12[7] = '\0';
        ppdVar7[iVar6] = pdVar12;
        iVar6 = iVar6 + 1;
        pdVar12 = pdVar12 + 8;
      } while (row_count != iVar6);
    }
  }
  else {
    if (LVar1 != BLOB) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Unsupported key type for CreateSortKey","");
      InternalException::InternalException(pIVar10,&local_b0);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (row_count != 0) {
      pdVar11 = result->data + 4;
      iVar6 = 0;
      pdVar12 = extraout_RDX;
      do {
        aVar13 = (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString
                           ((StringVector *)result,
                            (Vector *)
                            (local_88.constant_length +
                            local_88.variable_lengths.
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar6]),(idx_t)pdVar12);
        ((anon_union_16_2_67f50693_for_value *)(pdVar11 + -4))->pointer = aVar13;
        pdVar12 = (data_ptr_t)aVar13.ptr;
        if (aVar13.length < 0xd) {
          pdVar12 = pdVar11;
        }
        ppdVar7[iVar6] = pdVar12;
        iVar6 = iVar6 + 1;
        pdVar11 = pdVar11 + 0x10;
      } while (row_count != iVar6);
    }
  }
  local_48 = (void *)0x0;
  uStack_40 = 0;
  local_38 = 0;
  local_b0._M_dataplus._M_p = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,row_count,
             (value_type_conflict1 *)&local_b0);
  if ((sort_key_data->
      super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (sort_key_data->
      super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar8 = vector<duckdb::OrderModifiers,_true>::operator[](local_90,__n);
      local_68.modifiers = *pvVar8;
      local_68.flip_bytes = local_68.modifiers.order_type == DESCENDING;
      local_68.offsets = (unsafe_vector<idx_t> *)&local_48;
      local_68.result_data = ppdVar7;
      this = vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
             ::operator[](sort_key_data,__n);
      pSVar5 = unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
               ::operator*(this);
      local_b0._M_string_length = pSVar5->size;
      local_b0._M_dataplus._M_p = (pointer)0x0;
      local_b0.field_2._M_local_buf[8] = '\0';
      auVar3._8_8_ = local_b0.field_2._M_allocated_capacity;
      auVar3._0_8_ = local_b0._M_string_length;
      auVar3._16_8_ = (ulong)(uint7)local_b0.field_2._9_7_ << 8;
      auVar3._24_8_ = 0;
      ConstructSortKeyRecursive(pSVar5,(SortKeyChunk)(auVar3 << 0x40),&local_68);
      __n = __n + 1;
    } while (__n < (ulong)((long)(sort_key_data->
                                 super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(sort_key_data->
                                 super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  LVar1 = (result->type).id_;
  pdVar12 = result->data;
  if (LVar1 == BLOB) {
    if (row_count != 0) {
      pdVar12 = pdVar12 + 4;
      do {
        uVar9 = (ulong)*(uint *)(pdVar12 + -4);
        if (uVar9 < 0xd) {
          switchD_010444a0::default(pdVar12 + uVar9,0,0xc - uVar9);
        }
        else {
          *(undefined4 *)pdVar12 = **(undefined4 **)(pdVar12 + 4);
        }
        pdVar12 = pdVar12 + 0x10;
        row_count = row_count - 1;
      } while (row_count != 0);
    }
  }
  else {
    if (LVar1 != BIGINT) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Unsupported key type for CreateSortKey","");
      InternalException::InternalException(pIVar10,&local_b0);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (row_count != 0) {
      iVar6 = 0;
      do {
        uVar9 = *(ulong *)(pdVar12 + iVar6 * 8);
        *(ulong *)(pdVar12 + iVar6 * 8) =
             uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
             (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
             (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
        iVar6 = iVar6 + 1;
      } while (row_count != iVar6);
    }
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48);
  }
  operator_delete__(ppdVar7);
  if (local_88.variable_lengths.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.variable_lengths.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void CreateSortKeyInternal(vector<unique_ptr<SortKeyVectorData>> &sort_key_data,
                                  const vector<OrderModifiers> &modifiers, Vector &result, idx_t row_count) {
	// two phases
	// a) get the length of the final sorted key
	// b) allocate the sorted key and construct
	// we do all of this in a vectorized manner
	SortKeyLengthInfo key_lengths(row_count);
	for (auto &vector_data : sort_key_data) {
		GetSortKeyLength(*vector_data, key_lengths);
	}
	// allocate the empty sort keys
	auto data_pointers = unique_ptr<data_ptr_t[]>(new data_ptr_t[row_count]);
	PrepareSortData(result, row_count, key_lengths, data_pointers.get());

	unsafe_vector<idx_t> offsets;
	offsets.resize(row_count, 0);
	// now construct the sort keys
	for (idx_t c = 0; c < sort_key_data.size(); c++) {
		SortKeyConstructInfo info(modifiers[c], offsets, data_pointers.get());
		ConstructSortKey(*sort_key_data[c], info);
	}
	FinalizeSortData(result, row_count);
}